

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall
ON_Matrix::BackSolve(ON_Matrix *this,double zero_tolerance,int Bsize,ON_3dPoint *B,ON_3dPoint *X)

{
  double **ppdVar1;
  uint uVar2;
  int iVar3;
  double ***pppdVar4;
  long lVar5;
  ulong uVar6;
  ON_3dPoint *pOVar7;
  ulong uVar8;
  double dVar9;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  iVar3 = this->m_col_count;
  if ((iVar3 <= this->m_row_count) && (Bsize <= this->m_row_count && iVar3 <= Bsize)) {
    lVar5 = ((long)Bsize - (long)iVar3) + 1;
    pOVar7 = B + iVar3;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        iVar3 = this->m_col_count;
        pppdVar4 = &this->m;
        if (this->m_row_count == (this->m_rowmem).m_count) {
          pppdVar4 = &(this->m_rowmem).m_a;
        }
        ppdVar1 = *pppdVar4;
        if (X == B) {
          for (uVar2 = iVar3 - 2; uVar6 = (ulong)uVar2, -1 < (int)uVar2; uVar2 = uVar2 - 1) {
            pOVar7 = X + uVar6 + 1;
            uVar8 = uVar6;
            while (uVar8 = uVar8 + 1, (int)uVar8 < iVar3) {
              ::operator*(&local_60,ppdVar1[uVar6][uVar8],pOVar7);
              ON_3dVector::ON_3dVector(&local_48,&local_60);
              ON_3dPoint::operator-=(X + uVar6,&local_48);
              pOVar7 = pOVar7 + 1;
              iVar3 = this->m_col_count;
            }
          }
        }
        else {
          X[(long)iVar3 + -1].z = B[(long)iVar3 + -1].z;
          dVar9 = B[(long)iVar3 + -1].y;
          X[(long)iVar3 + -1].x = B[(long)iVar3 + -1].x;
          X[(long)iVar3 + -1].y = dVar9;
          for (uVar2 = this->m_col_count - 2; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
            uVar8 = (ulong)uVar2;
            pOVar7 = X + uVar8 + 1;
            X[uVar8].z = B[uVar8].z;
            dVar9 = B[uVar8].y;
            X[uVar8].x = B[uVar8].x;
            X[uVar8].y = dVar9;
            uVar6 = uVar8;
            while (uVar6 = uVar6 + 1, (int)uVar6 < this->m_col_count) {
              ::operator*(&local_60,ppdVar1[uVar8][uVar6],pOVar7);
              ON_3dVector::ON_3dVector(&local_48,&local_60);
              ON_3dPoint::operator-=(X + uVar8,&local_48);
              pOVar7 = pOVar7 + 1;
            }
          }
        }
        return true;
      }
      dVar9 = ON_3dPoint::MaximumCoordinate(pOVar7);
      pOVar7 = pOVar7 + 1;
    } while (dVar9 <= zero_tolerance);
  }
  return false;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int Bsize,
    const ON_3dPoint* B,
    ON_3dPoint* X
    ) const
{
  int i, j;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) {
    if ( B[i].MaximumCoordinate() > zero_tolerance )
      return false; // over determined
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( X != B )
  {
    X[m_col_count-1] = B[m_col_count-1];
    for ( i = m_col_count-2; i >= 0; i-- ) {
      X[i] = B[i];
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }

  return true;
}